

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O2

dtl_sv_t * dtl_sv_to_sv(dtl_sv_t *self)

{
  dtl_sv_t *dv;
  dtl_dv_type_id dVar1;
  
  if ((self != (dtl_sv_t *)0x0) && ((self->u32Flags & 0xf0) == 0xb0)) {
    dv = (dtl_sv_t *)(self->pAny->val).dv;
    dVar1 = dtl_dv_type((dtl_dv_t *)dv);
    if (dVar1 == DTL_DV_SCALAR) {
      return dv;
    }
  }
  return (dtl_sv_t *)0x0;
}

Assistant:

dtl_sv_t *dtl_sv_to_sv(const dtl_sv_t *self)
{
   if(self != 0)
   {
      if(dtl_sv_type(self) == DTL_SV_DV)
      {
         dtl_dv_t *dv = self->pAny->val.dv;
         if (dtl_dv_type(dv) == DTL_DV_SCALAR )
         {
            return (dtl_sv_t*) dv;
         }
      }
   }
   return (dtl_sv_t*) 0;
}